

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

arena_t * arena_choose_huge(tsd_t *tsd)

{
  ssize_t sVar1;
  tsdn_t *in_RDI;
  arena_t *huge_arena;
  arena_t *local_28;
  undefined8 in_stack_ffffffffffffffe8;
  tsdn_t *in_stack_fffffffffffffff0;
  
  local_28 = arena_get(in_stack_fffffffffffffff0,(uint)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                       SUB81((ulong)in_stack_ffffffffffffffe8 >> 0x18,0));
  if (local_28 == (arena_t *)0x0) {
    local_28 = arena_get(in_RDI,(uint)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                         SUB81((ulong)in_stack_ffffffffffffffe8 >> 0x18,0));
    if (local_28 == (arena_t *)0x0) {
      local_28 = (arena_t *)0x0;
    }
    else {
      sVar1 = arena_dirty_decay_ms_default_get();
      if (0 < sVar1) {
        arena_dirty_decay_ms_set(in_RDI,local_28,0x11e9a3);
      }
      sVar1 = arena_muzzy_decay_ms_default_get();
      if (0 < sVar1) {
        arena_muzzy_decay_ms_set(in_RDI,local_28,0x11e9ca);
      }
    }
  }
  return local_28;
}

Assistant:

arena_t *
arena_choose_huge(tsd_t *tsd) {
	/* huge_arena_ind can be 0 during init (will use a0). */
	if (huge_arena_ind == 0) {
		assert(!malloc_initialized());
	}

	arena_t *huge_arena = arena_get(tsd_tsdn(tsd), huge_arena_ind, false);
	if (huge_arena == NULL) {
		/* Create the huge arena on demand. */
		assert(huge_arena_ind != 0);
		huge_arena = arena_get(tsd_tsdn(tsd), huge_arena_ind, true);
		if (huge_arena == NULL) {
			return NULL;
		}
		/*
		 * Purge eagerly for huge allocations, because: 1) number of
		 * huge allocations is usually small, which means ticker based
		 * decay is not reliable; and 2) less immediate reuse is
		 * expected for huge allocations.
		 */
		if (arena_dirty_decay_ms_default_get() > 0) {
			arena_dirty_decay_ms_set(tsd_tsdn(tsd), huge_arena, 0);
		}
		if (arena_muzzy_decay_ms_default_get() > 0) {
			arena_muzzy_decay_ms_set(tsd_tsdn(tsd), huge_arena, 0);
		}
	}

	return huge_arena;
}